

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall
CUI::DoLabelHighlighted
          (CUI *this,CUIRect *pRect,char *pText,char *pHighlighted,float FontSize,vec4 *TextColor,
          vec4 *HighlightColor,int Align)

{
  int iVar1;
  uint uVar2;
  ITextRender *pIVar3;
  char *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  CUI *in_RDI;
  float in_XMM0_Da;
  char *pMatch;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CTextCursor *in_stack_ffffffffffffff80;
  CTextCursor *in_stack_ffffffffffffff88;
  char *pcVar4;
  CUI *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *local_60;
  
  if (DoLabelHighlighted(CUIRect_const*,char_const*,char_const*,float,vector4_base<float>const&,vector4_base<float>const&,int)
      ::s_Cursor == '\0') {
    iVar1 = __cxa_guard_acquire(&DoLabelHighlighted(CUIRect_const*,char_const*,char_const*,float,vector4_base<float>const&,vector4_base<float>const&,int)
                                 ::s_Cursor);
    if (iVar1 != 0) {
      CTextCursor::CTextCursor((CTextCursor *)in_stack_ffffffffffffff90);
      __cxa_atexit(CTextCursor::~CTextCursor,&DoLabelHighlighted::s_Cursor,&__dso_handle);
      __cxa_guard_release(&DoLabelHighlighted(CUIRect_const*,char_const*,char_const*,float,vector4_base<float>const&,vector4_base<float>const&,int)
                           ::s_Cursor);
    }
  }
  CTextCursor::Reset(in_stack_ffffffffffffff80,
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  DoLabelHighlighted::s_Cursor.m_MaxWidth = *(float *)(in_RSI + 8);
  DoLabelHighlighted::s_Cursor.m_FontSize = in_XMM0_Da;
  ApplyCursorAlign(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (CUIRect *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  TextRender(in_RDI);
  ITextRender::TextColor
            ((ITextRender *)in_stack_ffffffffffffff80,
             (vec4 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if ((in_RCX == (char *)0x0) || (*in_RCX == '\0')) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = str_find_nocase(in_stack_ffffffffffffff98,&in_stack_ffffffffffffff90->m_Enabled);
  }
  if (local_60 == (char *)0x0) {
    pIVar3 = TextRender(in_RDI);
    (*(pIVar3->super_IInterface)._vptr_IInterface[7])
              (pIVar3,&DoLabelHighlighted::s_Cursor,in_RDX,0xffffffff);
  }
  else {
    pIVar3 = TextRender(in_RDI);
    (*(pIVar3->super_IInterface)._vptr_IInterface[7])
              (pIVar3,&DoLabelHighlighted::s_Cursor,in_RDX,
               (ulong)(uint)((int)local_60 - (int)in_RDX));
    TextRender(in_RDI);
    ITextRender::TextColor
              ((ITextRender *)in_stack_ffffffffffffff80,
               (vec4 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    pIVar3 = TextRender(in_RDI);
    pcVar4 = local_60;
    uVar2 = str_length((char *)0x1dca5a);
    (*(pIVar3->super_IInterface)._vptr_IInterface[7])
              (pIVar3,&DoLabelHighlighted::s_Cursor,pcVar4,(ulong)uVar2);
    TextRender(in_RDI);
    ITextRender::TextColor
              (pIVar3,(vec4 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    pIVar3 = TextRender(in_RDI);
    iVar1 = str_length((char *)0x1dcaad);
    (*(pIVar3->super_IInterface)._vptr_IInterface[7])
              (pIVar3,&DoLabelHighlighted::s_Cursor,local_60 + iVar1,0xffffffff);
  }
  pIVar3 = TextRender(in_RDI);
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar3,&DoLabelHighlighted::s_Cursor,0,0xffffffff);
  return;
}

Assistant:

void CUI::DoLabelHighlighted(const CUIRect *pRect, const char *pText, const char *pHighlighted, float FontSize, const vec4 &TextColor, const vec4 &HighlightColor, int Align)
{
	static CTextCursor s_Cursor;
	s_Cursor.Reset();
	s_Cursor.m_FontSize = FontSize;
	s_Cursor.m_MaxWidth = pRect->w;
	ApplyCursorAlign(&s_Cursor, pRect, Align);

	TextRender()->TextColor(TextColor);
	const char *pMatch = pHighlighted && pHighlighted[0] ? str_find_nocase(pText, pHighlighted) : 0;
	if(pMatch)
	{
		TextRender()->TextDeferred(&s_Cursor, pText, (int)(pMatch - pText));
		TextRender()->TextColor(HighlightColor);
		TextRender()->TextDeferred(&s_Cursor, pMatch, str_length(pHighlighted));
		TextRender()->TextColor(TextColor);
		TextRender()->TextDeferred(&s_Cursor, pMatch + str_length(pHighlighted), -1);
	}
	else
		TextRender()->TextDeferred(&s_Cursor, pText, -1);

	TextRender()->DrawTextOutlined(&s_Cursor);
}